

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O0

void __thiscall vpl::Scope::LoadVariableAddr(Scope *this,string *name)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  pointer pNVar4;
  runtime_error *this_00;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  undefined1 local_28 [16];
  reverse_iterator iter;
  string *name_local;
  Scope *this_local;
  
  iter.current._M_current =
       (__normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>
        )(__normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>
          )name;
  poVar3 = std::operator<<(this->out_,'#');
  poVar3 = std::operator<<(poVar3,"void vpl::Scope::LoadVariableAddr(const std::string &)");
  std::operator<<(poVar3,'\n');
  std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>::rbegin
            ((vector<vpl::NameScope,_std::allocator<vpl::NameScope>_> *)(local_28 + 8));
  while( true ) {
    std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>::rend
              ((vector<vpl::NameScope,_std::allocator<vpl::NameScope>_> *)local_28);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>_>
                             *)(local_28 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>_>
                             *)local_28);
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      poVar3 = std::operator<<(local_1a0,"Undefined variable `");
      poVar3 = std::operator<<(poVar3,(string *)iter.current._M_current);
      std::operator<<(poVar3,'`');
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(this_00,local_1e0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pNVar4 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>_>
                           *)(local_28 + 8));
    bVar1 = NameScope::Contains(pNVar4,(string *)iter.current._M_current);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>_>
                  *)(local_28 + 8));
  }
  pNVar4 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>_>
                         *)(local_28 + 8));
  bVar1 = NameScope::IsGlobal(pNVar4);
  if (bVar1) {
    poVar3 = std::operator<<(this->out_,"    push ");
    poVar3 = std::operator<<(poVar3,(string *)iter.current._M_current);
    std::operator<<(poVar3,'\n');
  }
  else {
    poVar3 = std::operator<<(this->out_,"    push ");
    pNVar4 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>_>
                           *)(local_28 + 8));
    iVar2 = NameScope::GetOffset(pNVar4,(string *)iter.current._M_current);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<(this->out_,"    push %");
    iVar2 = StackPointerRegister(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,'\n');
    std::operator<<(this->out_,"    add\n");
  }
  this->cur_stack_pos_ = this->cur_stack_pos_ + 1;
  return;
}

Assistant:

void LoadVariableAddr(const std::string& name) {
        LOG
        for (auto iter = scopes_.rbegin(); iter != scopes_.rend(); ++iter) {
            if (iter->Contains(name)) {
                if (!iter->IsGlobal()) {
                    out_ << "    push " << iter->GetOffset(name) << '\n';
                    out_ << "    push %" << StackPointerRegister() << '\n';
                    out_ << "    add\n";
                } else {
                    out_ << "    push " << name << '\n';
                }
                ++cur_stack_pos_;
                return;
            }
        }
        std::stringstream ss;
        ss << "Undefined variable `" << name << '`';
        throw std::runtime_error(ss.str());
    }